

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void flatbuffers::kotlin::KotlinGenerator::GenerateJvmStaticAnnotation
               (CodeWriter *code,bool gen_jvmstatic)

{
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  CodeWriter *pCStack_10;
  bool gen_jvmstatic_local;
  CodeWriter *code_local;
  
  if (gen_jvmstatic) {
    local_11 = gen_jvmstatic;
    pCStack_10 = code;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"@JvmStatic",&local_39);
    CodeWriter::operator+=(pCStack_10,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

static void GenerateJvmStaticAnnotation(CodeWriter &code,
                                          bool gen_jvmstatic) {
    if (gen_jvmstatic) { code += "@JvmStatic"; }
  }